

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTRuntimeInfoTracker.cpp
# Opt level: O2

void __thiscall
TTD::ThreadContextTTD::AddNewScriptContext_Helper
          (ThreadContextTTD *this,ScriptContext *ctx,
          HostScriptContextCallbackFunctor *callbackFunctor,bool noNative,bool debugMode)

{
  FinalizableObject *pFVar1;
  void *pvVar2;
  JsTTDOnScriptLoadCallback p_Var3;
  JsTTDOnBPRegisterCallback p_Var4;
  JsTTDOnBPClearDocumentCallback p_Var5;
  bool bVar6;
  DebugContext *this_00;
  undefined3 in_register_00000009;
  ScriptContext *local_20;
  ScriptContext *ctx_local;
  
  pFVar1 = callbackFunctor->HostContext;
  pvVar2 = callbackFunctor->HostRuntime;
  p_Var3 = callbackFunctor->pfOnScriptLoadCallback;
  p_Var4 = callbackFunctor->pfOnBPRegisterCallback;
  p_Var5 = callbackFunctor->pfOnBPClearDocumentCallback;
  (ctx->TTDHostCallbackFunctor).pfOnBPDeleteCallback = callbackFunctor->pfOnBPDeleteCallback;
  (ctx->TTDHostCallbackFunctor).pfOnBPClearDocumentCallback = p_Var5;
  (ctx->TTDHostCallbackFunctor).pfOnScriptLoadCallback = p_Var3;
  (ctx->TTDHostCallbackFunctor).pfOnBPRegisterCallback = p_Var4;
  (ctx->TTDHostCallbackFunctor).HostContext = pFVar1;
  (ctx->TTDHostCallbackFunctor).HostRuntime = pvVar2;
  if (CONCAT31(in_register_00000009,noNative) != 0) {
    (ctx->config).NoNative = true;
  }
  local_20 = ctx;
  if (debugMode) {
    this_00 = Js::ScriptContext::GetDebugContext(ctx);
    Js::DebugContext::SetDebuggerMode(this_00,Debugging);
  }
  Js::ScriptContext::InitializeCoreImage_TTD(ctx);
  bVar6 = JsUtil::ReadOnlyList<Js::ScriptContext_*,_Memory::HeapAllocator,_DefaultComparer>::
          Contains(&(this->m_contextList).
                    super_ReadOnlyList<Js::ScriptContext_*,_Memory::HeapAllocator,_DefaultComparer>,
                   &local_20);
  if (!bVar6) {
    JsUtil::
    List<Js::ScriptContext_*,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>::
    Add(&this->m_contextList,&local_20);
    return;
  }
  TTDAbort_unrecoverable_error("We should only be adding at creation time!!!");
}

Assistant:

void ThreadContextTTD::AddNewScriptContext_Helper(Js::ScriptContext* ctx, HostScriptContextCallbackFunctor& callbackFunctor, bool noNative, bool debugMode)
    {
        ////
        //First just setup the standard things needed for a script context
        ctx->TTDHostCallbackFunctor = callbackFunctor;
        if(noNative)
        {
            ctx->ForceNoNative();
        }

        if(debugMode)
        {
#ifdef _WIN32
            ctx->InitializeDebugging();
#else
            //
            //TODO: x-plat does not like some parts of initiallize debugging so just set the flag we need
            //
            ctx->GetDebugContext()->SetDebuggerMode(Js::DebuggerMode::Debugging);
#endif
        }

        ctx->InitializeCoreImage_TTD();

        TTDAssert(!this->m_contextList.Contains(ctx), "We should only be adding at creation time!!!");
        this->m_contextList.Add(ctx);
    }